

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
defyx::AssemblyGeneratorX86::h_IADD_RS(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  ostream *poVar2;
  
  bVar1 = instr->dst;
  this->registerUsage[bVar1] = i;
  poVar2 = std::operator<<((ostream *)&this->field_0x10,"\tlea ");
  poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)instr->dst * 8));
  poVar2 = std::operator<<(poVar2,", [");
  poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)instr->dst * 8));
  poVar2 = std::operator<<(poVar2,"+");
  poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)instr->src * 8));
  poVar2 = std::operator<<(poVar2,"*");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,1 << (instr->mod >> 2 & 3));
  if (bVar1 == 5) {
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) | 0x800;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,instr->imm32);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffff7ff;
  }
  poVar2 = std::operator<<(poVar2,"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_IADD_RS(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if(instr.dst == RegisterNeedsDisplacement)
			asmCode << "\tlea " << regR[instr.dst] << ", [" << regR[instr.dst] << "+" << regR[instr.src] << "*" << (1 << (instr.getModShift())) << std::showpos << (int32_t)instr.getImm32() << std::noshowpos << "]" << std::endl;
		else
			asmCode << "\tlea " << regR[instr.dst] << ", [" << regR[instr.dst] << "+" << regR[instr.src] << "*" << (1 << (instr.getModShift())) << "]" << std::endl;
		traceint(instr);
	}